

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  long lVar1;
  mz_uint mVar2;
  mz_zip_internal_state *pArray;
  mz_uint16 method;
  tdefl_compressor *d;
  char cVar3;
  undefined1 uVar4;
  mz_bool mVar5;
  tdefl_status tVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  ulong min_new_capacity;
  ulong uVar10;
  size_t sVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  mz_uint64 mVar16;
  undefined8 uVar17;
  size_t sVar18;
  uint uVar19;
  mz_uint16 dos_date_00;
  undefined7 in_stack_ffffffffffffef48;
  void *pvVar20;
  void *pvVar21;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  tdefl_compressor *local_10a0;
  ulong local_1098;
  mz_uint64 local_1090;
  size_t local_1088;
  char *local_1080;
  void *local_1078;
  mz_ulong local_1070;
  mz_uint8 *local_1068;
  ulong local_1060;
  ulong local_1058;
  undefined8 local_1050;
  void *local_1048;
  void *local_1040;
  time_t cur_time;
  undefined8 local_1030;
  undefined8 local_1028;
  undefined1 local_1020;
  undefined1 local_101f;
  undefined1 local_101e;
  undefined1 local_101d;
  undefined2 local_101c;
  
  dos_time = 0;
  dos_date = 0;
  uVar13 = 6;
  if (-1 < (int)level_and_flags) {
    uVar13 = level_and_flags;
  }
  uVar19 = uVar13 & 0xf;
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < uVar19) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  uVar13 = uVar13 & 0x400;
  local_1078 = (void *)uncomp_size;
  local_1098 = uncomp_size | buf_size;
  if (local_1098 >> 0x20 != 0) {
    return 0;
  }
  if (uncomp_size != 0 && uVar13 == 0) {
    return 0;
  }
  cVar3 = *pArchive_name;
  if (cVar3 == '/') {
    return 0;
  }
  local_1070 = (mz_ulong)uncomp_crc32;
  local_1090 = pZip->m_archive_size;
  bVar15 = uVar19 == 0 | (byte)(uVar13 >> 10);
  pcVar9 = pArchive_name + 1;
  while (cVar3 != '\0') {
    if (cVar3 == ':') {
      return 0;
    }
    if (cVar3 == '\\') {
      return 0;
    }
    cVar3 = *pcVar9;
    pcVar9 = pcVar9 + 1;
  }
  local_1080 = pArchive_name;
  local_1068 = (mz_uint8 *)pBuf;
  local_1048 = pComment;
  time(&cur_time);
  (anonymous_namespace)::miniz::mz_zip_time_to_dos_time(cur_time,&dos_time,&dos_date);
  local_1088 = strlen(local_1080);
  if (0xffff < local_1088) {
    return 0;
  }
  mVar2 = pZip->m_file_offset_alignment;
  if (mVar2 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = mVar2 - ((uint)pZip->m_archive_size & mVar2 - 1) & mVar2 - 1;
  }
  uVar10 = (ulong)uVar14;
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  lVar1 = comment_size + local_1088;
  if (pZip->m_archive_size + lVar1 + uVar10 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  uVar17 = 0;
  if ((local_1088 != 0) && (local_1080[local_1088 - 1] == '/')) {
    if (local_1098 != 0) {
      return 0;
    }
    uVar17 = 0x10;
  }
  min_new_capacity = (pArray->m_central_dir).m_size + lVar1 + 0x2e;
  local_1098 = uVar10;
  if (((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
      (mVar5 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                         (pZip,&pArray->m_central_dir,min_new_capacity,1), mVar5 != 0)) &&
     ((uVar10 = (pArray->m_central_dir_offsets).m_size + 1, local_1050 = uVar17,
      uVar10 <= (pArray->m_central_dir_offsets).m_capacity ||
      (mVar5 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                         (pZip,&pArray->m_central_dir_offsets,uVar10,1), mVar5 != 0)))) {
    if ((void *)buf_size == (void *)0x0 || bVar15 != 0) {
      local_10a0 = (tdefl_compressor *)0x0;
    }
    else {
      local_10a0 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (local_10a0 == (tdefl_compressor *)0x0) {
        return 0;
      }
    }
    uVar10 = local_1098 + 0x1e;
    sVar11 = 0x1000;
    if ((uint)uVar10 < 0x1000) {
      sVar11 = uVar10 & 0xffffffff;
    }
    local_1060 = (ulong)comment_size;
    memset(&cur_time,0,sVar11);
    mVar16 = local_1090;
    local_1058 = uVar10;
    do {
      sVar11 = local_1088;
      uVar14 = (uint)uVar10;
      if (uVar14 == 0) {
        mVar16 = local_1058 + local_1090;
        sVar18 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,local_1080,local_1088);
        if (sVar18 != sVar11) break;
        mVar16 = mVar16 + sVar11;
        pvVar20 = (void *)buf_size;
        pvVar21 = local_1078;
        if ((uVar13 == 0) &&
           (local_1070 = mz_crc32(0,local_1068,buf_size), d = local_10a0, pvVar21 = pvVar20,
           ((void *)0x3 < buf_size & (bVar15 ^ 1)) != 0)) {
          local_1028 = (void *)0x0;
          cur_time = (time_t)pZip;
          local_1030 = mVar16;
          tdefl_init(local_10a0,(anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,
                     &cur_time,
                     (uint)(uVar19 < 4) << 0xe |
                     tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar19]);
          local_1040 = pvVar20;
          tVar6 = tdefl_compress(d,local_1068,(size_t *)&local_1040,(void *)0x0,(size_t *)0x0,
                                 TDEFL_FINISH);
          if (tVar6 != TDEFL_STATUS_DONE) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_10a0);
            return 0;
          }
          uVar12 = 8;
          uVar10 = local_1030;
          pvVar21 = local_1028;
          local_1078 = pvVar20;
        }
        else {
          local_1078 = pvVar21;
          pvVar21 = pvVar20;
          pvVar8 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,local_1068,(size_t)pvVar20);
          if (pvVar8 != pvVar20) break;
          uVar12 = (ushort)(uVar13 >> 7);
          uVar10 = mVar16 + (long)pvVar21;
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_10a0);
        method = dos_date;
        if ((ulong)pvVar21 >> 0x20 != 0) {
          return 0;
        }
        if (uVar10 >> 0x20 == 0) {
          mVar16 = local_1098 + local_1090;
          uVar4 = 0x14;
          if (uVar12 == 0) {
            uVar4 = 0;
          }
          cur_time = (time_t)CONCAT14(uVar4,0x4034b50);
          local_1090 = CONCAT44(local_1090._4_4_,(uint)dos_time);
          local_1030 = CONCAT17((char)(local_1070 >> 8),
                                CONCAT16((char)local_1070,
                                         CONCAT15((char)(dos_date >> 8),
                                                  CONCAT14((char)dos_date,
                                                           CONCAT13((char)(dos_time >> 8),
                                                                    CONCAT12((char)dos_time,uVar12))
                                                          ))));
          local_1028 = (void *)CONCAT17((char)((ulong)local_1078 >> 8),
                                        CONCAT16((char)local_1078,
                                                 CONCAT15((char)((ulong)pvVar21 >> 0x18),
                                                          CONCAT14((char)((ulong)pvVar21 >> 0x10),
                                                                   CONCAT13((char)((ulong)pvVar21 >>
                                                                                  8),CONCAT12((char)
                                                  pvVar21,(short)(local_1070 >> 0x10)))))));
          local_1020 = (undefined1)((ulong)local_1078 >> 0x10);
          local_101f = (undefined1)((ulong)local_1078 >> 0x18);
          local_101e = (undefined1)local_1088;
          local_101d = (undefined1)(local_1088 >> 8);
          local_101c = 0;
          dos_date_00 = 0xc79f;
          sVar18 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,&cur_time,0x1e);
          if (sVar18 == 0x1e) {
            mVar5 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                              (pZip,local_1080,(mz_uint16)local_1088,local_1048,
                               (mz_uint16)local_1060,local_1078,(mz_uint16)pvVar21,local_1070,
                               (ulong)uVar12,(uint)local_1090 & 0xffff,method,(mz_uint16)mVar16,
                               (mz_uint16)local_1050,dos_date_00,
                               CONCAT17(bVar15,in_stack_ffffffffffffef48),(mz_uint32)pvVar21);
            if (mVar5 != 0) {
              pZip->m_total_files = pZip->m_total_files + 1;
              pZip->m_archive_size = uVar10;
              return 1;
            }
            return 0;
          }
          return 0;
        }
        return 0;
      }
      sVar18 = 0x1000;
      if (uVar14 < 0x1000) {
        sVar18 = uVar10 & 0xffffffff;
      }
      sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,&cur_time,sVar18);
      mVar16 = mVar16 + sVar18;
      uVar10 = (ulong)(uVar14 - (int)sVar18);
    } while (sVar7 == sVar18);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_10a0);
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip,
                                 const char *pArchive_name, const void *pBuf,
                                 size_t buf_size, const void *pComment,
                                 mz_uint16 comment_size,
                                 mz_uint level_and_flags, mz_uint64 uncomp_size,
                                 mz_uint32 uncomp_crc32) {
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time;
    time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an
  // allocation fails the file remains unmodified. (A good idea if we're doing
  // an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir,
                                 MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                     archive_name_size + comment_size)) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}